

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

double duckdb::LogBaseOperator::Operation<double,double,double>(double b,double x)

{
  OutOfRangeException *this;
  double dVar1;
  allocator local_49;
  double local_48;
  double local_40;
  string local_38;
  
  local_40 = x;
  local_48 = Log10Operator::Operation<double,double>(b);
  if ((local_48 == 0.0) && (!NAN(local_48))) {
    this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"divison by zero in based logarithm",&local_49);
    OutOfRangeException::OutOfRangeException(this,&local_38);
    __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  dVar1 = Log10Operator::Operation<double,double>(local_40);
  return dVar1 / local_48;
}

Assistant:

static inline TR Operation(TA b, TB x) {
		auto divisor = Log10Operator::Operation<TA, TR>(b);
		if (divisor == 0) {
			throw OutOfRangeException("divison by zero in based logarithm");
		}
		return Log10Operator::Operation<TB, TR>(x) / divisor;
	}